

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O2

void __thiscall DCorpsePointer::DCorpsePointer(DCorpsePointer *this,AActor *ptr)

{
  DCorpsePointer *pDVar1;
  DCorpsePointer *pDVar2;
  TThinkerIterator<DCorpsePointer> iterator;
  
  DThinker::DThinker(&this->super_DThinker,3);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006ffcd8;
  (this->Corpse).field_0.p = ptr;
  this->Count = 0;
  TThinkerIterator<DCorpsePointer>::TThinkerIterator(&iterator,3);
  pDVar1 = (DCorpsePointer *)FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
  pDVar2 = pDVar1;
  if ((pDVar1 != this) && ((uint)sv_corpsequeuesize.Value <= pDVar1->Count)) {
    pDVar2 = (DCorpsePointer *)FThinkerIterator::Next(&iterator.super_FThinkerIterator,false);
    (*(pDVar1->super_DThinker).super_DObject._vptr_DObject[4])(pDVar1);
  }
  pDVar2->Count = pDVar2->Count + 1;
  return;
}

Assistant:

DCorpsePointer::DCorpsePointer (AActor *ptr)
: DThinker (STAT_CORPSEPOINTER), Corpse (ptr)
{
	Count = 0;

	// Thinkers are added to the end of their respective lists, so
	// the first thinker in the list is the oldest one.
	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *first = iterator.Next ();

	if (first != this)
	{
		if (first->Count >= (DWORD)sv_corpsequeuesize)
		{
			DCorpsePointer *next = iterator.Next ();
			first->Destroy ();
			first = next;
		}
	}
	++first->Count;
}